

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxratiotester.h
# Opt level: O2

void __thiscall
soplex::SPxRatioTester<double>::setDelta(SPxRatioTester<double> *this,double newDelta)

{
  Real RVar1;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_38;
  double local_28;
  double local_20;
  
  local_20 = newDelta;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,
             &(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
            );
  local_28 = Tolerances::epsilon(local_38._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  if (local_20 <= local_28) {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar1 = Tolerances::epsilon(local_38._M_ptr);
    this->delta = RVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  else {
    this->delta = local_20;
  }
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         delta = this->tolerances()->epsilon();
      else
         delta = newDelta;
   }